

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint64 ma_dr_wav_read_pcm_frames_f32(ma_dr_wav *pWav,ma_uint64 framesToRead,float *pBufferOut)

{
  ushort uVar1;
  uint uVar2;
  ma_uint64 mVar3;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  uint shift;
  uint uVar7;
  int iVar8;
  long lVar9;
  float *pfVar10;
  long lVar11;
  undefined8 *puVar12;
  ulong uVar13;
  uint j;
  ma_uint64 sample;
  ulong uVar14;
  ma_uint64 mVar15;
  ulong uVar16;
  ma_int16 samples16 [2048];
  undefined8 local_1038;
  
  if (framesToRead == 0 || pWav == (ma_dr_wav *)0x0) goto LAB_001681b1;
  if (pBufferOut == (float *)0x0) {
    mVar15 = ma_dr_wav_read_pcm_frames(pWav,framesToRead,(void *)0x0);
    return mVar15;
  }
  mVar15 = 0;
  switch(pWav->translatedFormatTag) {
  case 1:
    memset(&local_1038,0,0x1000);
    if ((pWav->bitsPerSample & 7) == 0) {
      uVar7 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
    }
    else {
      uVar7 = (uint)(pWav->fmt).blockAlign;
    }
    if (uVar7 != 0) {
      uVar1 = pWav->channels;
      uVar16 = (ulong)uVar7 / (ulong)uVar1;
      if (uVar7 < uVar1) {
        return 0;
      }
      if (uVar7 % (uint)uVar1 != 0) {
        return 0;
      }
      mVar15 = 0;
      uVar2 = (uint)uVar16;
      do {
        uVar6 = 0x1000 / (ulong)uVar7;
        if (framesToRead < 0x1000 / (ulong)uVar7) {
          uVar6 = framesToRead;
        }
        mVar3 = ma_dr_wav_read_pcm_frames(pWav,uVar6,&local_1038);
        if (mVar3 == 0) {
          return mVar15;
        }
        uVar6 = pWav->channels * mVar3;
        if (0x1000 < uVar6 * uVar16) {
          return mVar15;
        }
        switch(uVar2) {
        case 1:
          if (uVar6 != 0 && pBufferOut != (float *)0x0) {
            lVar9 = 0;
            do {
              pBufferOut[lVar9] = (float)*(byte *)((long)&local_1038 + lVar9) * 0.007843138 + -1.0;
              lVar9 = lVar9 + 1;
            } while (uVar6 - lVar9 != 0);
          }
          break;
        case 2:
          if (uVar6 != 0 && pBufferOut != (float *)0x0) {
            lVar9 = 0;
            do {
              pBufferOut[lVar9] =
                   (float)(int)*(short *)((long)&local_1038 + lVar9 * 2) * 3.0517578e-05;
              lVar9 = lVar9 + 1;
            } while (uVar6 - lVar9 != 0);
          }
          break;
        case 3:
          if (uVar6 != 0 && pBufferOut != (float *)0x0) {
            pbVar4 = (byte *)((long)&local_1038 + 2);
            lVar9 = 0;
            do {
              pBufferOut[lVar9] =
                   (float)((int)((uint)*pbVar4 << 0x18 | (uint)*(ushort *)(pbVar4 + -2) << 8) >> 8)
                   * 1.1920929e-07;
              lVar9 = lVar9 + 1;
              pbVar4 = pbVar4 + 3;
            } while (uVar6 - lVar9 != 0);
          }
          break;
        case 4:
          if (uVar6 != 0 && pBufferOut != (float *)0x0) {
            lVar9 = 0;
            do {
              pBufferOut[lVar9] = (float)*(int *)((long)&local_1038 + lVar9 * 4) * 4.656613e-10;
              lVar9 = lVar9 + 1;
            } while (uVar6 - lVar9 != 0);
          }
          break;
        default:
          if (uVar2 < 9) {
            if (uVar6 != 0) {
              uVar5 = 0;
              puVar12 = &local_1038;
              pfVar10 = pBufferOut;
              do {
                lVar9 = 0;
                uVar14 = 0;
                uVar13 = uVar16;
                iVar8 = uVar2 * -8 + 0x40;
                do {
                  uVar14 = uVar14 | (ulong)*(byte *)((long)puVar12 + lVar9) << ((byte)iVar8 & 0x3f);
                  iVar8 = iVar8 + 8;
                  lVar9 = lVar9 + 1;
                  uVar13 = uVar13 - 1;
                } while (uVar13 != 0);
                puVar12 = (undefined8 *)((long)puVar12 + uVar16);
                *pfVar10 = (float)((double)(long)uVar14 * 1.0842021724855044e-19);
                pfVar10 = pfVar10 + 1;
                uVar5 = (ulong)((int)uVar5 + 1);
              } while (uVar5 <= uVar6 && uVar6 - uVar5 != 0);
            }
          }
          else {
            memset(pBufferOut,0,uVar6 * 4);
          }
        }
        pBufferOut = pBufferOut + uVar6;
        mVar15 = mVar15 + mVar3;
        framesToRead = framesToRead - mVar3;
      } while (framesToRead != 0);
      return mVar15;
    }
    goto LAB_001681b1;
  case 3:
    memset(&local_1038,0,0x1000);
    uVar1 = pWav->bitsPerSample;
    if (uVar1 == 0x20) {
      mVar15 = ma_dr_wav_read_pcm_frames(pWav,framesToRead,pBufferOut);
      return mVar15;
    }
    if ((uVar1 & 7) == 0) {
      uVar7 = (uint)(pWav->fmt).channels * (uint)uVar1 >> 3;
    }
    else {
      uVar7 = (uint)(pWav->fmt).blockAlign;
    }
    if (uVar7 != 0) {
      uVar1 = pWav->channels;
      uVar2 = uVar7 / uVar1;
      if (uVar7 < uVar1) {
        return 0;
      }
      if (uVar7 % (uint)uVar1 != 0) {
        return 0;
      }
      mVar15 = 0;
      do {
        uVar16 = 0x1000 / (ulong)uVar7;
        if (framesToRead < 0x1000 / (ulong)uVar7) {
          uVar16 = framesToRead;
        }
        mVar3 = ma_dr_wav_read_pcm_frames(pWav,uVar16,&local_1038);
        if (mVar3 == 0) {
          return mVar15;
        }
        uVar16 = pWav->channels * mVar3;
        if (0x1000 < uVar16 * uVar2) {
          return mVar15;
        }
        if (uVar2 == 8) {
          if (uVar16 != 0 && pBufferOut != (float *)0x0) {
            lVar9 = 0;
            do {
              pBufferOut[lVar9] = (float)(double)(&local_1038)[lVar9];
              lVar9 = lVar9 + 1;
            } while (uVar16 - lVar9 != 0);
          }
        }
        else if (uVar2 == 4) {
          if (uVar16 != 0) {
            uVar6 = 0;
            do {
              pBufferOut[uVar6] = *(float *)((long)&local_1038 + uVar6 * 4);
              uVar6 = uVar6 + 1;
            } while ((uVar6 & 0xffffffff) <= uVar16 && uVar16 - (uVar6 & 0xffffffff) != 0);
          }
        }
        else {
          memset(pBufferOut,0,uVar16 * 4);
        }
        pBufferOut = pBufferOut + uVar16;
        mVar15 = mVar15 + mVar3;
        framesToRead = framesToRead - mVar3;
      } while (framesToRead != 0);
      return mVar15;
    }
LAB_001681b1:
    mVar15 = 0;
    break;
  case 4:
  case 5:
    break;
  case 6:
    memset(&local_1038,0,0x1000);
    if ((pWav->bitsPerSample & 7) == 0) {
      uVar1 = (pWav->fmt).channels;
      uVar7 = (uint)pWav->bitsPerSample * (uint)uVar1 >> 3;
    }
    else {
      uVar7 = (uint)(pWav->fmt).blockAlign;
      uVar1 = (pWav->fmt).channels;
    }
    mVar15 = 0;
    if ((uVar7 != 0) && (uVar7 == uVar1)) {
      uVar1 = pWav->channels;
      mVar15 = 0;
      if ((uVar1 <= uVar7) && ((short)((uVar7 & 0xffff) % (uint)uVar1) == 0)) {
        mVar15 = 0;
        uVar16 = (ulong)(ushort)(0x1000 / (uVar7 & 0xffff));
        do {
          uVar6 = uVar16;
          if (framesToRead < uVar16) {
            uVar6 = framesToRead;
          }
          mVar3 = ma_dr_wav_read_pcm_frames(pWav,uVar6,&local_1038);
          if (mVar3 == 0) {
            return mVar15;
          }
          lVar9 = pWav->channels * mVar3;
          if (0x1000 < lVar9 * (ulong)(ushort)((uVar7 & 0xffff) / (uint)uVar1)) {
            return mVar15;
          }
          if (lVar9 != 0 && pBufferOut != (float *)0x0) {
            lVar11 = 0;
            do {
              pBufferOut[lVar11] =
                   (float)(int)(short)g_ma_dr_wavAlawTable[*(byte *)((long)&local_1038 + lVar11)] *
                   3.0517578e-05;
              lVar11 = lVar11 + 1;
            } while (lVar9 - lVar11 != 0);
          }
          pBufferOut = pBufferOut + lVar9;
          mVar15 = mVar15 + mVar3;
          framesToRead = framesToRead - mVar3;
        } while (framesToRead != 0);
      }
    }
    break;
  case 7:
    memset(&local_1038,0,0x1000);
    if ((pWav->bitsPerSample & 7) == 0) {
      uVar1 = (pWav->fmt).channels;
      uVar7 = (uint)pWav->bitsPerSample * (uint)uVar1 >> 3;
    }
    else {
      uVar7 = (uint)(pWav->fmt).blockAlign;
      uVar1 = (pWav->fmt).channels;
    }
    mVar15 = 0;
    if ((uVar7 != 0) && (mVar15 = 0, uVar7 == uVar1)) {
      uVar1 = pWav->channels;
      mVar15 = 0;
      if ((uVar1 <= uVar7) && ((short)((uVar7 & 0xffff) % (uint)uVar1) == 0)) {
        mVar15 = 0;
        uVar16 = (ulong)(ushort)(0x1000 / (uVar7 & 0xffff));
        do {
          uVar6 = uVar16;
          if (framesToRead < uVar16) {
            uVar6 = framesToRead;
          }
          mVar3 = ma_dr_wav_read_pcm_frames(pWav,uVar6,&local_1038);
          if (mVar3 == 0) {
            return mVar15;
          }
          lVar9 = pWav->channels * mVar3;
          if (0x1000 < lVar9 * (ulong)(ushort)((uVar7 & 0xffff) / (uint)uVar1)) {
            return mVar15;
          }
          if (lVar9 != 0 && pBufferOut != (float *)0x0) {
            lVar11 = 0;
            do {
              pBufferOut[lVar11] =
                   (float)(int)(short)g_ma_dr_wavMulawTable[*(byte *)((long)&local_1038 + lVar11)] *
                   3.0517578e-05;
              lVar11 = lVar11 + 1;
            } while (lVar9 - lVar11 != 0);
          }
          pBufferOut = pBufferOut + lVar9;
          mVar15 = mVar15 + mVar3;
          framesToRead = framesToRead - mVar3;
        } while (framesToRead != 0);
      }
    }
    break;
  default:
    if (pWav->translatedFormatTag != 0x11) {
      return 0;
    }
  case 2:
    uVar16 = (ulong)pWav->channels;
    mVar15 = 0;
    do {
      uVar16 = (ulong)(ushort)(0x800 / (ushort)uVar16);
      if (framesToRead < uVar16) {
        uVar16 = framesToRead;
      }
      mVar3 = ma_dr_wav_read_pcm_frames_s16(pWav,uVar16,(ma_int16 *)&local_1038);
      if (mVar3 == 0) {
        return mVar15;
      }
      uVar16 = (ulong)pWav->channels;
      lVar9 = mVar3 * uVar16;
      if (lVar9 != 0 && pBufferOut != (float *)0x0) {
        lVar11 = 0;
        do {
          pBufferOut[lVar11] =
               (float)(int)*(short *)((long)&local_1038 + lVar11 * 2) * 3.0517578e-05;
          lVar11 = lVar11 + 1;
        } while (lVar9 - lVar11 != 0);
      }
      pBufferOut = pBufferOut + lVar9;
      mVar15 = mVar15 + mVar3;
      framesToRead = framesToRead - mVar3;
    } while (framesToRead != 0);
    return mVar15;
  }
  return mVar15;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_f32(ma_dr_wav* pWav, ma_uint64 framesToRead, float* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }
    if (pBufferOut == NULL) {
        return ma_dr_wav_read_pcm_frames(pWav, framesToRead, NULL);
    }
    if (framesToRead * pWav->channels * sizeof(float) > MA_SIZE_MAX) {
        framesToRead = MA_SIZE_MAX / sizeof(float) / pWav->channels;
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_PCM) {
        return ma_dr_wav_read_pcm_frames_f32__pcm(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ADPCM || pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
        return ma_dr_wav_read_pcm_frames_f32__msadpcm_ima(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_IEEE_FLOAT) {
        return ma_dr_wav_read_pcm_frames_f32__ieee(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ALAW) {
        return ma_dr_wav_read_pcm_frames_f32__alaw(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_MULAW) {
        return ma_dr_wav_read_pcm_frames_f32__mulaw(pWav, framesToRead, pBufferOut);
    }
    return 0;
}